

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O2

PatternGeneration * __thiscall
PatternGeneration::getPerlinNoiseTexture
          (PatternGeneration *this,int *imageSize,bool *random_colors,double *z1,double *z2,
          double *z3)

{
  anon_struct_24_3_668335fe_for_anon_union_5000_2_650ea050_for_random_device_0_0 *this_00;
  element_type *peVar1;
  uint uVar2;
  int iVar3;
  result_type rVar4;
  long lVar5;
  size_t *__return_storage_ptr__;
  int j;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double *in_stack_00000008;
  undefined1 local_27d0 [8];
  mt19937 mt;
  random_device rd;
  PerlinNoise pn;
  undefined1 local_70 [8];
  Vec3d val;
  
  iVar3 = *(int *)random_colors;
  __return_storage_ptr__ = &mt._M_p;
  val.super_Matx<double,_3,_1>.val[2] = (double)random_colors;
  cv::Scalar_<double>::all((Scalar_<double> *)__return_storage_ptr__,0.0);
  cv::Mat::Mat((Mat *)this,iVar3,iVar3,0x10,(Scalar_ *)__return_storage_ptr__);
  PerlinNoise::PerlinNoise((PerlinNoise *)((long)&rd.field_0 + 0x1380));
  std::random_device::random_device((random_device *)&mt._M_p);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)local_27d0,(ulong)uVar2);
  iVar3 = *(int *)val.super_Matx<double,_3,_1>.val[2];
  this_00 = &rd.field_0.field_0 + 0xd0;
  for (lVar7 = 0; lVar7 < iVar3; lVar7 = lVar7 + 1) {
    lVar8 = 0;
    for (lVar6 = 0; lVar6 < iVar3; lVar6 = lVar6 + 1) {
      dVar11 = (double)(int)lVar6 / (double)iVar3;
      dVar12 = (double)(int)lVar7 / (double)iVar3;
      cv::Matx<double,_3,_1>::Matx((Matx<double,_3,_1> *)local_70);
      if (*(char *)z1 == '\x01') {
        rVar4 = std::uniform_int_distribution<int>::operator()
                          (*(uniform_int_distribution<int> **)imageSize,
                           (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)local_27d0);
        dVar9 = PerlinNoise::noise((PerlinNoise *)this_00,dVar11,dVar12,(double)rVar4 / 2147483647.0
                                  );
        dVar10 = floor(dVar9 * 20.0);
        local_70 = (undefined1  [8])floor((dVar9 * 20.0 - dVar10) * 255.0);
        rVar4 = std::uniform_int_distribution<int>::operator()
                          (*(uniform_int_distribution<int> **)imageSize,
                           (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)local_27d0);
        dVar9 = PerlinNoise::noise((PerlinNoise *)this_00,dVar11,dVar12,(double)rVar4 / 2147483647.0
                                  );
        dVar10 = floor(dVar9 * 20.0);
        val.super_Matx<double,_3,_1>.val[0] = floor((dVar9 * 20.0 - dVar10) * 255.0);
        rVar4 = std::uniform_int_distribution<int>::operator()
                          (*(uniform_int_distribution<int> **)imageSize,
                           (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)local_27d0);
        dVar9 = (double)rVar4 / 2147483647.0;
      }
      else {
        dVar9 = PerlinNoise::noise((PerlinNoise *)this_00,dVar11,dVar12,*z2);
        dVar10 = floor(dVar9 * 20.0);
        local_70 = (undefined1  [8])floor((dVar9 * 20.0 - dVar10) * 255.0);
        dVar9 = PerlinNoise::noise((PerlinNoise *)this_00,dVar11,dVar12,*z3);
        dVar10 = floor(dVar9 * 20.0);
        val.super_Matx<double,_3,_1>.val[0] = floor((dVar9 * 20.0 - dVar10) * 255.0);
        dVar9 = *in_stack_00000008;
      }
      dVar11 = PerlinNoise::noise((PerlinNoise *)this_00,dVar11,dVar12,dVar9);
      dVar12 = floor(dVar11 * 20.0);
      val.super_Matx<double,_3,_1>.val[1] = floor((dVar11 * 20.0 - dVar12) * 255.0);
      cv::Vec::operator_cast_to_Vec
                ((Vec *)&pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      lVar5 = (long)(this[4].dist.
                     super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_vptr__Sp_counted_base * lVar7;
      peVar1 = this[1].dist.
               super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      *(undefined1 *)((long)&(peVar1->_M_param)._M_a + lVar8 + 2 + lVar5) =
           pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._2_1_;
      *(undefined2 *)((long)&(peVar1->_M_param)._M_a + lVar8 + lVar5) =
           pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._0_2_;
      iVar3 = *(int *)val.super_Matx<double,_3,_1>.val[2];
      lVar8 = lVar8 + 3;
    }
  }
  val.super_Matx<double,_3,_1>.val[1] = 0.0;
  local_70._0_4_ = 0x1010000;
  pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x2010000;
  val.super_Matx<double,_3,_1>.val[0] = (double)this;
  cv::cvtColor((cv *)local_70,
               (_InputArray *)
               &pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,(_OutputArray *)0x39,0,(int)__return_storage_ptr__);
  std::random_device::~random_device((random_device *)&mt._M_p);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)((long)&rd.field_0 + 0x1380));
  return this;
}

Assistant:

cv::Mat PatternGeneration::getPerlinNoiseTexture(
    const int & imageSize,
    const bool & random_colors,
    const double & z1,
    const double & z2,
    const double & z3)
{
    // Create an empty PPM image
    cv::Mat image(imageSize,imageSize,CV_8UC3,cv::Scalar::all(0));
    // Create a PerlinNoise object with a random permutation vector generated with seed
    //unsigned int seed = (*dist)(mt);
    PerlinNoise pn;

    std::random_device rd;
    std::mt19937 mt(rd());

    // Visit every pixel of the image and assign a color generated with Perlin noise
    #pragma omp parallel for
    for (int i = 0; i < imageSize; ++i) {      // y
        for (int j = 0; j < imageSize; ++j) {  // x

            double x = (double)j/((double)imageSize);
            double y = (double)i/((double)imageSize);

            cv::Vec3d val;

            // Wood like structure
            if(random_colors)
            {
                // Red
                val[0] = 20.0 * pn.noise(x, y, ((double) (*dist)(mt) / (RAND_MAX)));
                val[0] = val[0] - floor(val[0]);
                val[0] = floor(255 * val[0]);
                // Green
                val[1] = 20.0 * pn.noise(x, y, ((double) (*dist)(mt) / (RAND_MAX)));
                val[1] = val[1] - floor(val[1]);
                val[1] = floor(255 * val[1]);
                // Blue
                val[2] = 20.0 * pn.noise(x, y, ((double) (*dist)(mt) / (RAND_MAX)));
                val[2] = val[2] - floor(val[2]);
                val[2] = floor(255 * val[2]);

            } else {

                // Red
                val[0] = 20.0 * pn.noise(x, y, z1);
                val[0] = val[0] - floor(val[0]);
                val[0] = floor(255 * val[0]);
                // Green
                val[1] = 20.0 * pn.noise(x, y, z2);
                val[1] = val[1] - floor(val[1]);
                val[1] = floor(255 * val[1]);
                // Blue
                val[2] = 20.0 * pn.noise(x, y, z3);
                val[2] = val[2] - floor(val[2]);
                val[2] = floor(255 * val[2]);

            }
            image.at<cv::Vec3b>(i,j) = val;
        }
    }
    cvtColor(image,image,cv::COLOR_Lab2RGB); // converting back to 8U with scaling
    return image;
}